

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# app_parameters.cpp
# Opt level: O2

void __thiscall
AppParametersTest_null_Test::AppParametersTest_null_Test(AppParametersTest_null_Test *this)

{
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__Test_004a9c80;
  return;
}

Assistant:

TEST(AppParametersTest, null) {
	app_parameters parameters{ 0, static_cast<const char**>(nullptr) };
	app_parameters parameters2{ 1234, static_cast<const char**>(nullptr) };

	EXPECT_TRUE(parameters.name().empty());
	EXPECT_TRUE(parameters.arguments().empty());
	EXPECT_TRUE(parameters.switches().empty());
	EXPECT_TRUE(parameters.switches_set().empty());
	EXPECT_TRUE(parameters.values().empty());
	EXPECT_TRUE(parameters.as_object().null());

	EXPECT_TRUE(parameters2.name().empty());
	EXPECT_TRUE(parameters2.arguments().empty());
	EXPECT_TRUE(parameters2.switches().empty());
	EXPECT_TRUE(parameters2.switches_set().empty());
	EXPECT_TRUE(parameters2.values().empty());
	EXPECT_TRUE(parameters2.as_object().null());
}